

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QMetaType::registerMutableViewImpl<QList<QUrl>,QIterable<QMetaSequence>>
               (MutableViewFunction view,QMetaType fromType,QMetaType toType)

{
  char cVar1;
  QMetaType in_RDX;
  
  cVar1 = QMetaType::registerMutableViewFunction((function *)fromType.d_ptr,toType,in_RDX);
  if ((cVar1 != '\0') &&
     (registerMutableViewImpl<QList<QUrl>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
      ::unregister == '\0')) {
    registerMutableViewImpl<QList<QUrl>,QIterable<QMetaSequence>>();
  }
  return (bool)cVar1;
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }